

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.c
# Opt level: O0

xmlChar * xmlBuildRelativeURI(xmlChar *URI,xmlChar *base)

{
  int iVar1;
  int iVar2;
  xmlURIPtr uri;
  xmlChar *pxVar3;
  xmlChar *str;
  bool bVar4;
  bool bVar5;
  int local_74;
  char *pcStack_70;
  int pos;
  xmlChar *rptr;
  xmlChar *pxStack_60;
  int remove_path;
  xmlChar *vptr;
  xmlChar *uptr;
  xmlChar *bptr;
  xmlURIPtr bas;
  xmlURIPtr ref;
  int len;
  int nbslash;
  int ix;
  int ret;
  xmlChar *val;
  xmlChar *base_local;
  xmlChar *URI_local;
  
  _ix = (xmlChar *)0x0;
  ref._4_4_ = 0;
  bptr = (xmlChar *)0x0;
  bVar4 = false;
  if ((URI == (xmlChar *)0x0) || (*URI == '\0')) {
    return (xmlChar *)0x0;
  }
  uri = xmlCreateURI();
  if (uri == (xmlURIPtr)0x0) {
    return (xmlChar *)0x0;
  }
  if (*URI == '.') {
    pxVar3 = xmlStrdup(URI);
    uri->path = (char *)pxVar3;
  }
  else {
    iVar1 = xmlParseURIReference(uri,(char *)URI);
    if (iVar1 != 0) goto LAB_001cafa0;
  }
  if ((base == (xmlChar *)0x0) || (*base == '\0')) {
    _ix = xmlStrdup(URI);
  }
  else {
    bptr = (xmlChar *)xmlCreateURI();
    if ((xmlURIPtr)bptr != (xmlURIPtr)0x0) {
      if (*base == '.') {
        pxVar3 = xmlStrdup(base);
        ((xmlURIPtr)bptr)->path = (char *)pxVar3;
      }
      else {
        iVar1 = xmlParseURIReference((xmlURIPtr)bptr,(char *)base);
        if (iVar1 != 0) goto LAB_001cafa0;
      }
      if ((uri->scheme == (char *)0x0) ||
         (((((xmlURIPtr)bptr)->scheme != (char *)0x0 &&
           (iVar1 = xmlStrcmp((xmlChar *)((xmlURIPtr)bptr)->scheme,(xmlChar *)uri->scheme),
           iVar1 == 0)) &&
          (iVar1 = xmlStrcmp((xmlChar *)((xmlURIPtr)bptr)->server,(xmlChar *)uri->server),
          iVar1 == 0)))) {
        iVar1 = xmlStrEqual((xmlChar *)((xmlURIPtr)bptr)->path,(xmlChar *)uri->path);
        if (iVar1 == 0) {
          if (((xmlURIPtr)bptr)->path == (char *)0x0) {
            _ix = xmlStrdup((xmlChar *)uri->path);
          }
          else {
            bVar4 = uri->path == (char *)0x0;
            if (bVar4) {
              uri->path = "/";
            }
            uptr = (xmlChar *)((xmlURIPtr)bptr)->path;
            pcStack_70 = uri->path;
            local_74 = 0;
            if ((*pcStack_70 == '.') && (pcStack_70[1] == '/')) {
              pcStack_70 = pcStack_70 + 2;
            }
            if ((*uptr == '.') && (uptr[1] == '/')) {
              uptr = uptr + 2;
            }
            else if ((*uptr == '/') && (*pcStack_70 != '/')) {
              uptr = uptr + 1;
            }
            while( true ) {
              bVar5 = false;
              if (uptr[local_74] == pcStack_70[local_74]) {
                bVar5 = uptr[local_74] != '\0';
              }
              if (!bVar5) break;
              local_74 = local_74 + 1;
            }
            if (uptr[local_74] == pcStack_70[local_74]) {
              _ix = xmlStrdup("");
            }
            else {
              len = local_74;
              while ((0 < len && (pcStack_70[len + -1] != '/'))) {
                len = len + -1;
              }
              pxVar3 = (xmlChar *)(pcStack_70 + len);
              for (; uptr[len] != '\0'; len = len + 1) {
                if (uptr[len] == '/') {
                  ref._4_4_ = ref._4_4_ + 1;
                }
              }
              if ((ref._4_4_ == 0) && (*pxVar3 == '\0')) {
                _ix = xmlStrdup((xmlChar *)"./");
              }
              else {
                iVar1 = xmlStrlen(pxVar3);
                iVar2 = iVar1 + 1;
                if (ref._4_4_ == 0) {
                  if (pxVar3 != (xmlChar *)0x0) {
                    _ix = xmlURIEscapeStr(pxVar3,(xmlChar *)"/;&=+$,");
                  }
                }
                else {
                  str = (xmlChar *)(*xmlMalloc)((long)(iVar2 + ref._4_4_ * 3));
                  pxStack_60 = str;
                  if (str == (xmlChar *)0x0) {
                    xmlURIErrMemory("building relative URI\n");
                    _ix = (xmlChar *)0x0;
                  }
                  else {
                    for (; 0 < ref._4_4_; ref._4_4_ = ref._4_4_ + -1) {
                      *pxStack_60 = '.';
                      pxStack_60[1] = '.';
                      pxStack_60[2] = '/';
                      pxStack_60 = pxStack_60 + 3;
                    }
                    if (pxVar3 == (xmlChar *)0x0) {
                      pxStack_60[iVar1] = '\0';
                    }
                    else if ((((str < pxStack_60) && (0 < iVar2)) && (*pxVar3 == '/')) &&
                            (pxStack_60[-1] == '/')) {
                      memcpy(pxStack_60,pxVar3 + 1,(long)iVar1);
                      pxStack_60[iVar1 + -1] = '\0';
                    }
                    else {
                      memcpy(pxStack_60,pxVar3,(long)iVar2);
                      pxStack_60[iVar1] = '\0';
                    }
                    _ix = xmlURIEscapeStr(str,(xmlChar *)"/;&=+$,");
                    (*xmlFree)(str);
                  }
                }
              }
            }
          }
        }
        else {
          _ix = xmlStrdup("");
        }
      }
      else {
        _ix = xmlStrdup(URI);
      }
    }
  }
LAB_001cafa0:
  if (bVar4) {
    uri->path = (char *)0x0;
  }
  if (uri != (xmlURIPtr)0x0) {
    xmlFreeURI(uri);
  }
  if (bptr != (xmlChar *)0x0) {
    xmlFreeURI((xmlURIPtr)bptr);
  }
  return _ix;
}

Assistant:

xmlChar *
xmlBuildRelativeURI (const xmlChar * URI, const xmlChar * base)
{
    xmlChar *val = NULL;
    int ret;
    int ix;
    int nbslash = 0;
    int len;
    xmlURIPtr ref = NULL;
    xmlURIPtr bas = NULL;
    xmlChar *bptr, *uptr, *vptr;
    int remove_path = 0;

    if ((URI == NULL) || (*URI == 0))
	return NULL;

    /*
     * First parse URI into a standard form
     */
    ref = xmlCreateURI ();
    if (ref == NULL)
	return NULL;
    /* If URI not already in "relative" form */
    if (URI[0] != '.') {
	ret = xmlParseURIReference (ref, (const char *) URI);
	if (ret != 0)
	    goto done;		/* Error in URI, return NULL */
    } else
	ref->path = (char *)xmlStrdup(URI);

    /*
     * Next parse base into the same standard form
     */
    if ((base == NULL) || (*base == 0)) {
	val = xmlStrdup (URI);
	goto done;
    }
    bas = xmlCreateURI ();
    if (bas == NULL)
	goto done;
    if (base[0] != '.') {
	ret = xmlParseURIReference (bas, (const char *) base);
	if (ret != 0)
	    goto done;		/* Error in base, return NULL */
    } else
	bas->path = (char *)xmlStrdup(base);

    /*
     * If the scheme / server on the URI differs from the base,
     * just return the URI
     */
    if ((ref->scheme != NULL) &&
	((bas->scheme == NULL) ||
	 (xmlStrcmp ((xmlChar *)bas->scheme, (xmlChar *)ref->scheme)) ||
	 (xmlStrcmp ((xmlChar *)bas->server, (xmlChar *)ref->server)))) {
	val = xmlStrdup (URI);
	goto done;
    }
    if (xmlStrEqual((xmlChar *)bas->path, (xmlChar *)ref->path)) {
	val = xmlStrdup(BAD_CAST "");
	goto done;
    }
    if (bas->path == NULL) {
	val = xmlStrdup((xmlChar *)ref->path);
	goto done;
    }
    if (ref->path == NULL) {
        ref->path = (char *) "/";
	remove_path = 1;
    }

    /*
     * At this point (at last!) we can compare the two paths
     *
     * First we take care of the special case where either of the
     * two path components may be missing (bug 316224)
     */
    bptr = (xmlChar *)bas->path;
    {
        xmlChar *rptr = (xmlChar *) ref->path;
        int pos = 0;

        /*
         * Next we compare the two strings and find where they first differ
         */
	if ((*rptr == '.') && (rptr[1] == '/'))
            rptr += 2;
	if ((*bptr == '.') && (bptr[1] == '/'))
            bptr += 2;
	else if ((*bptr == '/') && (*rptr != '/'))
	    bptr++;
	while ((bptr[pos] == rptr[pos]) && (bptr[pos] != 0))
	    pos++;

	if (bptr[pos] == rptr[pos]) {
	    val = xmlStrdup(BAD_CAST "");
	    goto done;		/* (I can't imagine why anyone would do this) */
	}

	/*
	 * In URI, "back up" to the last '/' encountered.  This will be the
	 * beginning of the "unique" suffix of URI
	 */
	ix = pos;
	for (; ix > 0; ix--) {
	    if (rptr[ix - 1] == '/')
		break;
	}
	uptr = (xmlChar *)&rptr[ix];

	/*
	 * In base, count the number of '/' from the differing point
	 */
	for (; bptr[ix] != 0; ix++) {
	    if (bptr[ix] == '/')
		nbslash++;
	}

	/*
	 * e.g: URI="foo/" base="foo/bar" -> "./"
	 */
	if (nbslash == 0 && !uptr[0]) {
	    val = xmlStrdup(BAD_CAST "./");
	    goto done;
	}

	len = xmlStrlen (uptr) + 1;
    }

    if (nbslash == 0) {
	if (uptr != NULL)
	    /* exception characters from xmlSaveUri */
	    val = xmlURIEscapeStr(uptr, BAD_CAST "/;&=+$,");
	goto done;
    }

    /*
     * Allocate just enough space for the returned string -
     * length of the remainder of the URI, plus enough space
     * for the "../" groups, plus one for the terminator
     */
    val = (xmlChar *) xmlMalloc (len + 3 * nbslash);
    if (val == NULL) {
        xmlURIErrMemory("building relative URI\n");
	goto done;
    }
    vptr = val;
    /*
     * Put in as many "../" as needed
     */
    for (; nbslash>0; nbslash--) {
	*vptr++ = '.';
	*vptr++ = '.';
	*vptr++ = '/';
    }
    /*
     * Finish up with the end of the URI
     */
    if (uptr != NULL) {
        if ((vptr > val) && (len > 0) &&
	    (uptr[0] == '/') && (vptr[-1] == '/')) {
	    memcpy (vptr, uptr + 1, len - 1);
	    vptr[len - 2] = 0;
	} else {
	    memcpy (vptr, uptr, len);
	    vptr[len - 1] = 0;
	}
    } else {
	vptr[len - 1] = 0;
    }

    /* escape the freshly-built path */
    vptr = val;
	/* exception characters from xmlSaveUri */
    val = xmlURIEscapeStr(vptr, BAD_CAST "/;&=+$,");
    xmlFree(vptr);

done:
    /*
     * Free the working variables
     */
    if (remove_path != 0)
        ref->path = NULL;
    if (ref != NULL)
	xmlFreeURI (ref);
    if (bas != NULL)
	xmlFreeURI (bas);

    return val;
}